

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void ActionUnserialize::
     SerReadWriteMany<ParamsStream<AutoFile&,TransactionSerParams>,COutPoint&,CScript&,unsigned_int&>
               (ParamsStream<AutoFile_&,_TransactionSerParams> *s,COutPoint *args,CScript *args_1,
               uint *args_2)

{
  long lVar1;
  CScript *in_RCX;
  COutPoint *in_RDX;
  ParamsStream<AutoFile_&,_TransactionSerParams> *in_RSI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UnserializeMany<ParamsStream<AutoFile&,TransactionSerParams>,COutPoint&,CScript&,unsigned_int&>
            (in_RSI,in_RDX,in_RCX,(uint *)0x3bf681);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SerReadWriteMany(Stream& s, Args&&... args)
    {
        ::UnserializeMany(s, args...);
    }